

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O3

void __thiscall Wasm::WasmBinaryReader::ValidateModuleHeader(WasmBinaryReader *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint sourceContextId;
  undefined4 *puVar5;
  FunctionInfo *pFVar6;
  char16_t *msg;
  FunctionBody *pFVar7;
  
  if ((DAT_015932e2 == '\0') && (0x40000000 < (uint)(*(int *)&this->m_end - *(int *)&this->m_pc))) {
    msg = L"Module too big";
    goto LAB_00f10e15;
  }
  uVar3 = ReadConst<unsigned_int>(this);
  uVar4 = ReadConst<unsigned_int>(this);
  pFVar7 = (this->m_funcState).body;
  if (pFVar7 == (FunctionBody *)0x0 || this->m_readerState != READER_STATE_FUNCTION) {
    this = (WasmBinaryReader *)&DAT_015b6718;
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,WasmReaderPhase);
    if (bVar2) {
LAB_00f10cfe:
      Output::Print(L"Module Header: Magic 0x%x, Version %u",(ulong)uVar3,(ulong)uVar4);
      this = (WasmBinaryReader *)0xfbee92;
      Output::Print(L"\n");
      Output::Flush();
    }
  }
  else {
    sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar7);
    if (this->m_readerState == READER_STATE_FUNCTION) {
      pFVar7 = (this->m_funcState).body;
    }
    else {
      pFVar7 = (FunctionBody *)0x0;
    }
    pFVar6 = (pFVar7->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar6 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
      pFVar6 = (pFVar7->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    this = (WasmBinaryReader *)&DAT_015b6718;
    bVar2 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015b6718,WasmReaderPhase,sourceContextId,pFVar6->functionId);
    if (bVar2) goto LAB_00f10cfe;
  }
  if (uVar3 == 0x6d736100) {
    if ((uVar4 == 1) || (DAT_015932e0 == '\0')) {
      return;
    }
    msg = L"Invalid WASM version!";
  }
  else {
    msg = L"Malformed WASM module header!";
  }
LAB_00f10e15:
  ThrowDecodingError(this,msg);
}

Assistant:

void WasmBinaryReader::ValidateModuleHeader()
{
    uint32 bytesLeft = (uint32)(m_end - m_pc);
    if (bytesLeft > Limits::GetMaxModuleSize())
    {
        ThrowDecodingError(_u("Module too big"));
    }

    uint32 magicNumber = ReadConst<uint32>();
    uint32 version = ReadConst<uint32>();
    TRACE_WASM_DECODER(_u("Module Header: Magic 0x%x, Version %u"), magicNumber, version);
    if (magicNumber != 0x6d736100)
    {
        ThrowDecodingError(_u("Malformed WASM module header!"));
    }

    if (CONFIG_FLAG(WasmCheckVersion))
    {
        if (version != binaryVersion)
        {
            ThrowDecodingError(_u("Invalid WASM version!"));
        }
    }
}